

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryTransfer
          (InMemoryDirectory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode)

{
  size_t sVar1;
  InMemoryFileFactory *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 uVar6;
  int iVar7;
  Predicate *pPVar8;
  size_t sVar9;
  char *pcVar10;
  String *pSVar11;
  bool bVar12;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  NullableValue<kj::String> _kj_result;
  Fault f;
  anon_union_32_1_a8a2e026_for_OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>_2
  aStack_d0;
  Date local_98;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 aStack_90;
  String link;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  newNode;
  
  sVar9 = toPath.parts.size_;
  pSVar11 = toPath.parts.ptr;
  if (sVar9 == 1) {
    if ((toMode & MODIFY) == 0) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&f,&this->impl)
      ;
      if ((pSVar11->content).size_ == 0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = (pSVar11->content).ptr;
      }
      name_00.content.size_ = (size_t)pcVar10;
      name_00.content.ptr = (char *)aStack_d0._0_8_;
      Impl::tryGetEntry((Impl *)&newNode,name_00);
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&f);
      if (CONCAT44(newNode._4_4_,newNode.tag) != 0) goto LAB_001d82fd;
    }
    newNode.tag = 0;
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[9])
              (&f,fromDirectory,CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_));
    if ((char)f.exception == '\x01') {
      if (aStack_d0._0_4_ == 0) {
        (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
                  (&link,fromDirectory,CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_),
                   CONCAT44(fromPath.parts.size_._4_4_,(undefined4)fromPath.parts.size_),2);
        local_98.value.value =
             (Quantity<long,_kj::_::NanosecondLabel>)
             (Quantity<long,_kj::_::NanosecondLabel>)link.content.ptr;
        aStack_90.value.content.ptr = (char *)link.content.size_;
        link.content.size_ = 0;
        Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&link);
        uVar3 = aStack_90.value.content.ptr;
        if ((_Base_ptr)aStack_90.value.content.ptr == (_Base_ptr)0x0) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                    ((Fault *)&link,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x516,FAILED,
                     "fromDirectory.tryOpenFile(fromPath, WriteMode::MODIFY) != nullptr",
                     "\"source node deleted concurrently during transfer\", fromPath",
                     (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
          _::Debug::Fault::fatal((Fault *)&link);
        }
        f.exception = (Exception *)local_98.value.value;
        aStack_90.value.content.ptr = (char *)0x0;
        Own<const_kj::File,_std::nullptr_t>::dispose
                  ((Own<const_kj::File,_std::nullptr_t> *)&local_98);
        _kj_result._0_8_ = f.exception;
        _kj_result.field_1.value.content.ptr = (char *)uVar3;
        Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&f);
        if (mode == COPY) {
          pIVar2 = (this->impl).value.fileFactory;
          (*(code *)**(undefined8 **)pIVar2)(&f,pIVar2,(this->impl).value.clock);
          (**(code **)(lRam0000000000000000 + 0x68))
                    (0,0,_kj_result.field_1.value.content.ptr,0,aStack_d0._8_8_);
          Own<const_kj::File,_std::nullptr_t>::operator=
                    ((Own<const_kj::File,_std::nullptr_t> *)&_kj_result,
                     (Own<const_kj::File,_std::nullptr_t> *)&f);
          Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&f);
        }
        _kj_result.field_1.value.content.ptr = (char *)0x0;
        local_98.value.value =
             (Quantity<long,_kj::_::NanosecondLabel>)
             (Quantity<long,_kj::_::NanosecondLabel>)_kj_result._0_8_;
        f.exception._0_4_ = 1;
        aStack_d0._0_8_ = _kj_result._0_8_;
        aStack_90.value.content.ptr = (char *)0x0;
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::operator=(&newNode,(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                              *)&f);
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::~OneOf((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                  *)&f);
        Own<const_kj::File,_std::nullptr_t>::dispose
                  ((Own<const_kj::File,_std::nullptr_t> *)&local_98);
        Own<const_kj::File,_std::nullptr_t>::dispose
                  ((Own<const_kj::File,_std::nullptr_t> *)&_kj_result);
      }
      else if (aStack_d0._0_4_ == 1) {
        (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
                  (&link,fromDirectory,CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_),
                   CONCAT44(fromPath.parts.size_._4_4_,(undefined4)fromPath.parts.size_),2);
        local_98.value.value =
             (Quantity<long,_kj::_::NanosecondLabel>)
             (Quantity<long,_kj::_::NanosecondLabel>)link.content.ptr;
        aStack_90.value.content.ptr = (char *)link.content.size_;
        link.content.size_ = 0;
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)&link);
        uVar3 = aStack_90.value.content.ptr;
        if ((_Base_ptr)aStack_90.value.content.ptr == (_Base_ptr)0x0) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                    ((Fault *)&link,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x524,FAILED,
                     "fromDirectory.tryOpenSubdir(fromPath, WriteMode::MODIFY) != nullptr",
                     "\"source node deleted concurrently during transfer\", fromPath",
                     (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
          _::Debug::Fault::fatal((Fault *)&link);
        }
        f.exception = (Exception *)local_98.value.value;
        aStack_90.value.content.ptr = (char *)0x0;
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)&local_98);
        _kj_result._0_8_ = f.exception;
        _kj_result.field_1.value.content.ptr = (char *)uVar3;
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)&f);
        if (mode == MOVE) {
          if ((fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode !=
              (_func_int **)&PTR_getFd_0025ff50) {
            Impl::copyDirectory((Impl *)&f,(Directory *)&(this->impl).value,
                                SUB81(_kj_result.field_1.value.content.ptr,0));
            Own<const_kj::Directory,_std::nullptr_t>::operator=
                      ((Own<const_kj::Directory,_std::nullptr_t> *)&_kj_result,
                       (Own<const_kj::Directory,_std::nullptr_t> *)&f);
            Own<const_kj::Directory,_std::nullptr_t>::dispose
                      ((Own<const_kj::Directory,_std::nullptr_t> *)&f);
          }
        }
        else if (mode == COPY) {
          Impl::copyDirectory((Impl *)&f,(Directory *)&(this->impl).value,
                              SUB81(_kj_result.field_1.value.content.ptr,0));
          Own<const_kj::Directory,_std::nullptr_t>::operator=
                    ((Own<const_kj::Directory,_std::nullptr_t> *)&_kj_result,
                     (Own<const_kj::Directory,_std::nullptr_t> *)&f);
          Own<const_kj::Directory,_std::nullptr_t>::dispose
                    ((Own<const_kj::Directory,_std::nullptr_t> *)&f);
        }
        _kj_result.field_1.value.content.ptr = (char *)0x0;
        local_98.value.value =
             (Quantity<long,_kj::_::NanosecondLabel>)
             (Quantity<long,_kj::_::NanosecondLabel>)_kj_result._0_8_;
        f.exception._0_4_ = 2;
        aStack_d0._0_8_ = _kj_result._0_8_;
        aStack_90.value.content.ptr = (char *)0x0;
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::operator=(&newNode,(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                              *)&f);
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::~OneOf((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                  *)&f);
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)&local_98);
        Own<const_kj::Directory,_std::nullptr_t>::dispose
                  ((Own<const_kj::Directory,_std::nullptr_t> *)&_kj_result);
      }
      else {
        if (aStack_d0._0_4_ != 2) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51],kj::PathPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x54f,FAILED,(char *)0x0,
                     "\"InMemoryDirectory can\'t link an inode of this type\", fromPath",
                     (char (*) [51])"InMemoryDirectory can\'t link an inode of this type",&fromPath)
          ;
          _::Debug::Fault::fatal(&f);
        }
        (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xc])
                  (&local_98,fromDirectory,
                   CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_));
        _kj_result.isSet = local_98.value.value._0_1_;
        if (local_98.value.value._0_1_ == true) {
          _kj_result.field_1.value.content.ptr = aStack_90.value.content.ptr;
          _kj_result.field_1.value.content.size_ = aStack_90.value.content.size_;
          _kj_result.field_1.value.content.disposer = aStack_90.value.content.disposer;
          aStack_90.value.content.ptr = (char *)0x0;
          aStack_90.value.content.size_ = 0;
        }
        _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&local_98);
        uVar5 = _kj_result.field_1.value.content.disposer;
        uVar4 = _kj_result.field_1.value.content.size_;
        uVar3 = _kj_result.field_1.value.content.ptr;
        if (_kj_result.isSet == false) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                    ((Fault *)&local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x549,FAILED,"fromDirectory.tryReadlink(fromPath) != nullptr",
                     "\"source node deleted concurrently during transfer\", fromPath",
                     (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
          _::Debug::Fault::fatal((Fault *)&local_98);
        }
        f.exception._0_1_ = _kj_result.isSet;
        _kj_result.field_1.value.content.ptr = (char *)0x0;
        _kj_result.field_1.value.content.size_ = 0;
        _::NullableValue<kj::String>::~NullableValue(&_kj_result);
        link.content.ptr = (char *)uVar3;
        link.content.size_ = uVar4;
        link.content.disposer = (ArrayDisposer *)uVar5;
        aStack_d0._0_8_ = (Waiter *)0x0;
        _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&f);
        _kj_result._0_8_ = aStack_d0._24_8_;
        _kj_result.field_1.value.content.ptr = link.content.ptr;
        _kj_result.field_1.value.content.size_ = link.content.size_;
        _kj_result.field_1.value.content.disposer = link.content.disposer;
        link.content.ptr = (char *)0x0;
        link.content.size_ = 0;
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::OneOf<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode,int>
                  ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                    *)&f,(SymlinkNode *)&_kj_result);
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::operator=(&newNode,(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                              *)&f);
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::~OneOf((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                  *)&f);
        Array<char>::~Array(&_kj_result.field_1.value.content);
        Array<char>::~Array(&link.content);
      }
      if (mode == MOVE) {
        iVar7 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                          (fromDirectory,CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_)
                           ,CONCAT44(fromPath.parts.size_._4_4_,(undefined4)fromPath.parts.size_));
        _kj_result.isSet = SUB41(iVar7,0);
        if (SUB41(iVar7,0) == false) {
          _::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[19],kj::PathPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x553,FAILED,"fromDirectory.tryRemove(fromPath)",
                     "_kjCondition,\"couldn\'t move node\", fromPath",
                     (DebugExpression<bool> *)&_kj_result,(char (*) [19])"couldn\'t move node",
                     &fromPath);
          _::Debug::Fault::fatal(&f);
        }
      }
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&f,&this->impl)
      ;
      sVar9 = (pSVar11->content).size_;
      if (sVar9 == 0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = (pSVar11->content).ptr;
      }
      name_01.content.size_ = (size_t)pcVar10;
      name_01.content.ptr = (char *)aStack_d0._0_8_;
      Impl::openEntry((Impl *)&_kj_result,name_01,(int)sVar9 + (uint)(sVar9 == 0));
      bVar12 = _kj_result._0_8_ != 0;
      if (bVar12) {
        EntryImpl::init((EntryImpl *)_kj_result._0_8_,(EVP_PKEY_CTX *)&newNode);
        pPVar8 = (Predicate *)(**(code **)**(undefined8 **)aStack_d0._0_8_)();
        *(Predicate **)(aStack_d0._0_8_ + 0x40) = pPVar8;
      }
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&f);
    }
    else {
      bVar12 = false;
    }
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::~OneOf(&newNode);
  }
  else {
    if (sVar9 != 0) {
      sVar1 = (pSVar11->content).size_;
      if (sVar1 == 0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = (pSVar11->content).ptr;
      }
      name.content.size_ = (size_t)pcVar10;
      name.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)&newNode,name,(int)sVar1 + (uint)(sVar1 == 0));
      uVar3 = newNode.field_1._0_8_;
      newNode.field_1._0_8_ = 0;
      Own<const_kj::Directory,_std::nullptr_t>::dispose
                ((Own<const_kj::Directory,_std::nullptr_t> *)&newNode);
      if (uVar3 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (**(code **)(*(long *)uVar3 + 0xa0))
                          (uVar3,pSVar11 + 1,sVar9 - 1,toMode,fromDirectory,mode,
                           CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_),
                           CONCAT44(fromPath.parts.size_._4_4_,(undefined4)fromPath.parts.size_));
      }
      Own<const_kj::Directory,_std::nullptr_t>::dispose
                ((Own<const_kj::Directory,_std::nullptr_t> *)&f);
      return (bool)uVar6;
    }
    if ((toMode & CREATE) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4fe,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      _::Debug::Fault::~Fault(&f);
      return false;
    }
LAB_001d82fd:
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode) const override {
    if (toPath.size() == 0) {
      if (has(toMode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (toPath.size() == 1) {
      if (!has(toMode, WriteMode::MODIFY)) {
        // Replacement is not allowed, so we'll have to check upfront if the target path exists.
        // Unfortunately we have to take a lock and then drop it immediately since we can't keep
        // the lock held while accessing `fromDirectory`.
        if (impl.lockShared()->tryGetEntry(toPath[0]) != kj::none) {
          return false;
        }
      }

      OneOf<FileNode, DirectoryNode, SymlinkNode> newNode;
      FsNode::Metadata meta;
      KJ_IF_SOME(m, fromDirectory.tryLstat(fromPath)) {
        meta = m;
      } else {
        return false;
      }

      switch (meta.type) {
        case FsNode::Type::FILE: {
          auto file = KJ_ASSERT_NONNULL(
              fromDirectory.tryOpenFile(fromPath, WriteMode::MODIFY),
              "source node deleted concurrently during transfer", fromPath);

          if (mode == TransferMode::COPY) {
            auto copy = impl.getWithoutLock().newFile();
            copy->copy(0, *file, 0, meta.size);
            file = kj::mv(copy);
          }

          newNode = FileNode { kj::mv(file) };
          break;
        }
        case FsNode::Type::DIRECTORY: {
          auto subdir = KJ_ASSERT_NONNULL(
              fromDirectory.tryOpenSubdir(fromPath, WriteMode::MODIFY),
              "source node deleted concurrently during transfer", fromPath);

          switch (mode) {
            case TransferMode::COPY:
              // Copying is straightforward: Make a deep copy of the entire directory tree,
              // including file contents.
              subdir = impl.getWithoutLock().copyDirectory(*subdir, /* copyFiles = */ true);
              break;

            case TransferMode::LINK:
              // To "link", we can safely just place `subdir` directly into our own tree.
              break;

            case TransferMode::MOVE:
              // Moving may be tricky:
              //
              // If `fromDirectory` is an `InMemoryDirectory`, then we know that removing the
              // subdir just unlinks the object without modifying it, so we can safely just link it
              // into our own tree.
              //
              // However, if `fromDirectory` is a disk directory, then removing the subdir will
              // likely perform a recursive delete, thus leaving `subdir` pointing to an empty
              // directory. If we link that into our tree, it's useless. So, instead, perform a
              // deep copy of the directory tree upfront, into an InMemoryDirectory. However, file
              // content need not be copied, since unlinked files keep their contents until closed.
              if (kj::dynamicDowncastIfAvailable<const InMemoryDirectory>(fromDirectory) ==
                  kj::none) {
                subdir = impl.getWithoutLock().copyDirectory(*subdir, /* copyFiles = */ false);
              }
              break;
          }

          newNode = DirectoryNode { kj::mv(subdir) };
          break;
        }
        case FsNode::Type::SYMLINK: {
          auto link = KJ_ASSERT_NONNULL(fromDirectory.tryReadlink(fromPath),
              "source node deleted concurrently during transfer", fromPath);

          newNode = SymlinkNode {meta.lastModified, kj::mv(link)};
          break;
        }
        default:
          KJ_FAIL_REQUIRE("InMemoryDirectory can't link an inode of this type", fromPath);
      }

      if (mode == TransferMode::MOVE) {
        KJ_ASSERT(fromDirectory.tryRemove(fromPath), "couldn't move node", fromPath);
      }

      // Take the lock to insert the entry into our map. Remember that it's important we do not
      // manipulate `fromDirectory` while the lock is held, since it could be the same directory.
      {
        auto lock = impl.lockExclusive();
        KJ_IF_SOME(targetEntry, lock->openEntry(toPath[0], toMode)) {
          targetEntry.init(kj::mv(newNode));;
        } else {
          return false;
        }
        lock->modified();
      }

      return true;
    } else {
      // TODO(someday): Ideally we wouldn't create parent directories if fromPath doesn't exist.
      //   This requires a different approach to the code here, though.
      KJ_IF_SOME(child, tryGetParent(toPath[0], toMode)) {
        return child->tryTransfer(
            toPath.slice(1, toPath.size()), toMode, fromDirectory, fromPath, mode);
      } else {
        return false;
      }
    }
  }